

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_> __thiscall
Parser::parseFunctionCallStatement(Parser *this,optional<Token> *identifierToken)

{
  Mark MVar1;
  Mark *pMVar2;
  _Optional_base<Token,_false,_false> *in_RDX;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string local_88;
  _Optional_payload_base<Token> local_68;
  
  pMVar2 = Stream::getMark((Stream *)identifierToken);
  MVar1 = *pMVar2;
  std::_Optional_base<Token,_false,_false>::_Optional_base
            ((_Optional_base<Token,_false,_false> *)&local_68,in_RDX);
  parseFunctionCall((Parser *)local_90,identifierToken);
  std::_Optional_payload_base<Token>::_M_reset(&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_90 + 8),"Expected semicolon!",&local_91);
  expectToken((Parser *)identifierToken,Semicolon,(string *)(local_90 + 8));
  std::__cxx11::string::~string((string *)(local_90 + 8));
  std::
  make_unique<FunctionCallStatementNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)this);
  *(Mark *)((this->tokenizer_).stream_.is_ + 8) = MVar1;
  if (local_90 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_90 + 8))();
  }
  return (__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
          )(__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallStatementNode> Parser::parseFunctionCallStatement(std::optional<Token> identifierToken)
{
  const auto mark = tokenizer_.getMark();
  auto functionCall = parseFunctionCall(identifierToken);
  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<FunctionCallStatementNode>(std::move(functionCall));
  node->setMark(mark);
  return node;
}